

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O2

ssize_t __thiscall Pl_Buffer::write(Pl_Buffer *this,int __fd,void *__buf,size_t __n)

{
  Pipeline *pPVar1;
  int iVar2;
  Members *in_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  if (__buf != (void *)0x0) {
    std::__cxx11::string::append
              ((char *)&((this->m)._M_t.
                         super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                         .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl)->data,
               CONCAT44(in_register_00000034,__fd));
    in_RAX = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
             _M_t.
             super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
             super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl;
    in_RAX->ready = false;
    pPVar1 = (this->super_Pipeline).next_;
    if (pPVar1 != (Pipeline *)0x0) {
      iVar2 = (*pPVar1->_vptr_Pipeline[2])(pPVar1,CONCAT44(in_register_00000034,__fd),__buf);
      return CONCAT44(extraout_var,iVar2);
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void
Pl_Buffer::write(unsigned char const* buf, size_t len)
{
    if (!len) {
        return;
    }
    m->data.append(reinterpret_cast<char const*>(buf), len);
    m->ready = false;

    if (next()) {
        next()->write(buf, len);
    }
}